

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cldperm.c
# Opt level: O1

int cldperm(int job,int n,int_t nnz,int_t *colptr,int_t *adjncy,singlecomplex *nzval,int *perm,
           float *u,float *v)

{
  double *a;
  double *dw;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  int_t nnz_local;
  int_t liw;
  int local_18c;
  int_t num;
  int_t ln;
  int_t ljob;
  int_t ldw;
  int_t *local_178;
  ulong local_170;
  int_t info [10];
  int_t icntl [10];
  
  nnz_local = nnz;
  a = (double *)superlu_malloc((long)nnz << 3);
  liw = n * 5;
  if (job == 3) {
    liw = n * 10 + nnz_local;
  }
  local_18c = job;
  local_178 = intMalloc(liw);
  if (local_178 == (int_t *)0x0) {
    sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for iw[]",0x6f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cldperm.c");
    superlu_abort_and_exit((char *)icntl);
  }
  lVar4 = (long)nnz_local + (long)n * 3;
  ldw = (int_t)lVar4;
  dw = (double *)superlu_malloc(lVar4 * 8);
  if (dw == (double *)0x0) {
    sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for dw[]",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cldperm.c");
    superlu_abort_and_exit((char *)icntl);
  }
  if (-1 < n) {
    uVar1 = 0;
    do {
      colptr[uVar1] = colptr[uVar1] + 1;
      uVar1 = uVar1 + 1;
    } while (n + 1 != uVar1);
  }
  if (0 < (long)nnz_local) {
    lVar4 = 0;
    do {
      adjncy[lVar4] = adjncy[lVar4] + 1;
      lVar4 = lVar4 + 1;
    } while (nnz_local != lVar4);
  }
  mc64id_(icntl);
  ljob = local_18c;
  ln = n;
  local_170 = (ulong)(uint)n;
  if (0 < nnz_local) {
    lVar4 = 0;
    do {
      dVar5 = c_abs1(nzval);
      a[lVar4] = dVar5;
      lVar4 = lVar4 + 1;
      nzval = nzval + 1;
    } while (lVar4 < nnz_local);
  }
  mc64ad_(&ljob,&ln,&nnz_local,colptr,adjncy,a,&num,perm,&liw,local_178,&ldw,dw,icntl,info);
  uVar1 = local_170;
  iVar3 = (int)local_170;
  if (info[0] == 1) {
    printf(".. The last %d permutations:\n",(ulong)(uint)(iVar3 - num));
    slu_PrintInt10("perm",iVar3 - num,perm + num);
  }
  if (-1 < iVar3) {
    uVar2 = 0;
    do {
      colptr[uVar2] = colptr[uVar2] + -1;
      uVar2 = uVar2 + 1;
    } while (iVar3 + 1 != uVar2);
  }
  if (0 < (long)nnz_local) {
    lVar4 = 0;
    do {
      adjncy[lVar4] = adjncy[lVar4] + -1;
      lVar4 = lVar4 + 1;
    } while (nnz_local != lVar4);
  }
  uVar1 = uVar1 & 0xffffffff;
  if (0 < iVar3) {
    uVar2 = 0;
    do {
      perm[uVar2] = perm[uVar2] + -1;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  if (0 < iVar3 && local_18c == 5) {
    uVar2 = 0;
    do {
      u[uVar2] = (float)dw[uVar2];
      v[uVar2] = (float)dw[uVar1 + uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  superlu_free(local_178);
  superlu_free(dw);
  superlu_free(a);
  return info[0];
}

Assistant:

int
cldperm(int job, int n, int_t nnz, int_t colptr[], int_t adjncy[],
	singlecomplex nzval[], int *perm, float u[], float v[])
{
    int_t i, num;
    int_t icntl[10], info[10];
    int_t liw, ldw, *iw;
    double *dw;
    double *nzval_d = (double *) SUPERLU_MALLOC(nnz * sizeof(double));

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter cldperm()");
#endif
    liw = 5*n;
    if ( job == 3 ) liw = 10*n + nnz;
    if ( !(iw = intMalloc(liw)) ) ABORT("Malloc fails for iw[]");
    ldw = 3*n + nnz;
    if ( !(dw = (double*) SUPERLU_MALLOC(ldw * sizeof(double))) )
          ABORT("Malloc fails for dw[]");
	    
    /* Increment one to get 1-based indexing. */
    for (i = 0; i <= n; ++i) ++colptr[i];
    for (i = 0; i < nnz; ++i) ++adjncy[i];
#if ( DEBUGlevel>=2 )
    printf("LDPERM(): n %d, nnz %lld\n", n, (long long) nnz);
    slu_PrintInt10("colptr", n+1, colptr);
    slu_PrintInt10("adjncy", nnz, adjncy);
#endif
	
    /* 
     * NOTE:
     * =====
     *
     * MC64AD assumes that column permutation vector is defined as:
     * perm(i) = j means column i of permuted A is in column j of original A.
     *
     * Since a symmetric permutation preserves the diagonal entries. Then
     * by the following relation:
     *     P'(A*P')P = P'A
     * we can apply inverse(perm) to rows of A to get large diagonal entries.
     * But, since 'perm' defined in MC64AD happens to be the reverse of
     * SuperLU's definition of permutation vector, therefore, it is already
     * an inverse for our purpose. We will thus use it directly.
     *
     */
    mc64id_(icntl);
#if 0
    /* Suppress error and warning messages. */
    icntl[0] = -1;
    icntl[1] = -1;
#endif

    int_t ljob = job, ln = n;
    
    for (i = 0; i < nnz; ++i) nzval_d[i] = c_abs1(&nzval[i]);
    mc64ad_(&ljob, &ln, &nnz, colptr, adjncy, nzval_d, &num, perm,
	    &liw, iw, &ldw, dw, icntl, info);

#if ( DEBUGlevel>=2 )
    slu_PrintInt10("perm", n, perm);
    printf(".. After MC64AD info %lld\tsize of matching %lld\n", (long long)info[0], (long long) num);
#endif
    if ( info[0] == 1 ) { /* Structurally singular */
        printf(".. The last %d permutations:\n", (int)(n-num));
	slu_PrintInt10("perm", n-num, &perm[num]);
    }

    /* Restore to 0-based indexing. */
    for (i = 0; i <= n; ++i) --colptr[i];
    for (i = 0; i < nnz; ++i) --adjncy[i];
    for (i = 0; i < n; ++i) --perm[i];

    if ( job == 5 )
        for (i = 0; i < n; ++i) {
	    u[i] = dw[i];
	    v[i] = dw[n+i];
	}

    SUPERLU_FREE(iw);
    SUPERLU_FREE(dw);
    SUPERLU_FREE(nzval_d);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit cldperm()");
#endif

    return info[0];
}